

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void enter_room(tgestate_t *state)

{
  byte bVar1;
  uint16_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint16_t uVar5;
  
  (state->game_window_offset).x = '\0';
  (state->game_window_offset).y = '\0';
  setup_room(state);
  plot_interior_tiles(state);
  (state->map_position).x = 't';
  (state->map_position).y = 0xea;
  state->vischars[0].input = 0x80;
  bVar1 = state->vischars[0].direction;
  if (state->room_index < 0x1d) {
    state->vischars[0].direction = bVar1 & 0xfb;
  }
  else {
    state->vischars[0].direction = bVar1 | 4;
    state->vischars[0].mi.sprite = sprites + 2;
  }
  uVar3._0_2_ = state->vischars[0].mi.mappos.u;
  uVar3._2_2_ = state->vischars[0].mi.mappos.v;
  uVar4 = *(undefined4 *)&state->vischars[0].mi.mappos.w;
  *(undefined4 *)&state->saved_mappos = uVar3;
  uVar5 = (uint16_t)uVar4;
  (state->saved_mappos).pos16.w = uVar5;
  uVar2 = (state->saved_mappos).pos16.v;
  state->vischars[0].isopos.x = (uVar2 - (undefined2)uVar3) * 2 + 0x400;
  state->vischars[0].isopos.y = 0x800 - ((undefined2)uVar3 + uVar2 + uVar5);
  setup_movable_items(state);
  zoombox(state);
  increase_score(state,'\x01');
  longjmp((__jmp_buf_tag *)state->jmpbuf_main,1);
}

Assistant:

void enter_room(tgestate_t *state)
{
  assert(state != NULL);

  state->game_window_offset.x = 0;
  state->game_window_offset.y = 0;
  // FUTURE: replace with call to setup_room_and_plot
  setup_room(state);
  plot_interior_tiles(state);
  state->map_position.x = 116;
  state->map_position.y = 234;
  set_hero_sprite_for_room(state);
  calc_vischar_isopos_from_vischar(state, &state->vischars[0]);
  setup_movable_items(state);
  zoombox(state);
  increase_score(state, 1);

  squash_stack_goto_main(state); /* was fallthrough */
  NEVER_RETURNS;
}